

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall RTree::showAll_values_JSON(RTree *this,RTree_node *node,int level,string *json)

{
  pointer *ppPVar1;
  uint uVar2;
  uint uVar3;
  pointer pPVar4;
  RTree_node *pRVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong uVar11;
  pointer pPVar12;
  Point *pPVar13;
  ulong uVar14;
  long *plVar15;
  ulong *puVar16;
  uint uVar17;
  string *psVar18;
  string __str;
  string __str_3;
  string __str_2;
  vector<Point,_std::allocator<Point>_> vertices;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  vector<Point,_std::allocator<Point>_> local_110;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string *local_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  RTree_node *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long local_80;
  long *local_78 [2];
  long local_68 [2];
  int local_54;
  vector<Point,_std::allocator<Point>_> local_50;
  RTree *local_38;
  
  local_d0 = json;
  local_a8 = node;
  local_38 = this;
  if (node->is_leaf == false) {
    if (0 < node->elements) {
      local_54 = level + 1;
      local_80 = 0;
      do {
        std::__cxx11::string::append((char *)json);
        uVar2 = node->at_level;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_001061eb;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_001061eb;
            }
            if (uVar8 < 10000) goto LAB_001061eb;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_001061eb:
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_f0 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar3);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1092b2);
        plVar15 = plVar10 + 2;
        ppPVar1 = &local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if ((long *)*plVar10 == plVar15) {
          local_120 = *plVar15;
          lStack_118 = plVar10[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar15;
          local_130 = (long *)*plVar10;
        }
        local_128 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        pPVar12 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pPVar12) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          lStack_f8 = plVar10[3];
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppPVar1;
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)local_d0,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)ppPVar1) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct((ulong)&local_f0,'\x01');
        *(undefined1 *)local_f0 = 0x30;
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1092bb);
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_120 = *plVar15;
          lStack_118 = plVar10[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar15;
          local_130 = (long *)*plVar10;
        }
        local_128 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        pPVar12 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pPVar12) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          lStack_f8 = plVar10[3];
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppPVar1;
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)local_d0,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)ppPVar1) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        lVar6 = local_80;
        uVar2 = ((node->data_internal_node).
                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                 super__Vector_impl_data._M_start[local_80].region)->key;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_001064d6;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_001064d6;
            }
            if (uVar8 < 10000) goto LAB_001064d6;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_001064d6:
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_f0 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar3);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1092c6);
        pRVar5 = local_a8;
        local_130 = &local_120;
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_120 = *plVar15;
          lStack_118 = plVar10[3];
        }
        else {
          local_120 = *plVar15;
          local_130 = (long *)*plVar10;
        }
        local_128 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        pPVar12 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pPVar12) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          lStack_f8 = plVar10[3];
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)local_d0,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        std::__cxx11::string::append((char *)local_d0);
        uVar2 = (((pRVar5->data_internal_node).
                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6].region)->Pmin).X;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_001066ad;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_001066ad;
            }
            if (uVar8 < 10000) goto LAB_001066ad;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_001066ad:
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct
                  ((ulong)local_78,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_78[0]),uVar17,uVar3);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1092d8);
        pRVar5 = local_a8;
        local_a0 = &local_90;
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_90 = *plVar15;
          lStack_88 = plVar10[3];
        }
        else {
          local_90 = *plVar15;
          local_a0 = (long *)*plVar10;
        }
        local_98 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_a0);
        puVar16 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar16) {
          local_e0 = *puVar16;
          lStack_d8 = plVar10[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar16;
          local_f0 = (ulong *)*plVar10;
        }
        local_e8 = plVar10[1];
        *plVar10 = (long)puVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        uVar2 = (((pRVar5->data_internal_node).
                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6].region)->Pmin).Y;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00106815;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00106815;
            }
            if (uVar8 < 10000) goto LAB_00106815;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_00106815:
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c8,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_c8),uVar17,uVar3);
        pRVar5 = local_a8;
        uVar11 = 0xf;
        if (local_f0 != &local_e0) {
          uVar11 = local_e0;
        }
        if (uVar11 < (ulong)(local_c0 + local_e8)) {
          uVar11 = 0xf;
          if (local_c8 != local_b8) {
            uVar11 = local_b8[0];
          }
          if (uVar11 < (ulong)(local_c0 + local_e8)) goto LAB_0010689d;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_0010689d:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_c8);
        }
        local_130 = &local_120;
        plVar10 = puVar9 + 2;
        if ((long *)*puVar9 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = puVar9[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*puVar9;
        }
        local_128 = puVar9[1];
        *puVar9 = plVar10;
        puVar9[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        pPVar12 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pPVar12) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          lStack_f8 = plVar10[3];
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)local_d0,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        uVar2 = (((pRVar5->data_internal_node).
                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6].region)->Pmax).X;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00106a8c;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00106a8c;
            }
            if (uVar8 < 10000) goto LAB_00106a8c;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_00106a8c:
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct
                  ((ulong)local_78,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_78[0]),uVar17,uVar3);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1092d8);
        pRVar5 = local_a8;
        local_a0 = &local_90;
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_90 = *plVar15;
          lStack_88 = plVar10[3];
        }
        else {
          local_90 = *plVar15;
          local_a0 = (long *)*plVar10;
        }
        local_98 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        puVar16 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar16) {
          local_e0 = *puVar16;
          lStack_d8 = puVar9[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar16;
          local_f0 = (ulong *)*puVar9;
        }
        local_e8 = puVar9[1];
        *puVar9 = puVar16;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        uVar2 = (((pRVar5->data_internal_node).
                  super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6].region)->Pmax).Y;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar11 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00106bf4;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00106bf4;
            }
            if (uVar8 < 10000) goto LAB_00106bf4;
            uVar11 = uVar11 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_00106bf4:
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c8,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_c8),uVar17,uVar3);
        node = local_a8;
        uVar11 = 0xf;
        if (local_f0 != &local_e0) {
          uVar11 = local_e0;
        }
        if (uVar11 < (ulong)(local_c0 + local_e8)) {
          uVar11 = 0xf;
          if (local_c8 != local_b8) {
            uVar11 = local_b8[0];
          }
          if (uVar11 < (ulong)(local_c0 + local_e8)) goto LAB_00106c7c;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_00106c7c:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_c8);
        }
        local_130 = &local_120;
        plVar10 = puVar9 + 2;
        if ((long *)*puVar9 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = puVar9[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*puVar9;
        }
        local_128 = puVar9[1];
        *puVar9 = plVar10;
        puVar9[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        pPVar12 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pPVar12) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          lStack_f8 = plVar10[3];
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar12;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)local_d0,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        json = local_d0;
        std::__cxx11::string::append((char *)local_d0);
        std::__cxx11::string::append((char *)json);
        showAll_values_JSON(local_38,(node->data_internal_node).
                                     super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar6].child,local_54
                            ,json);
        local_80 = local_80 + 1;
      } while (local_80 < node->elements);
    }
  }
  else if (0 < node->elements) {
    local_80 = 0;
    local_54 = level;
    do {
      pRVar5 = local_a8;
      psVar18 = local_d0;
      std::__cxx11::string::append((char *)local_d0);
      uVar2 = pRVar5->at_level;
      uVar3 = -uVar2;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      uVar17 = 1;
      if (9 < uVar3) {
        uVar11 = (ulong)uVar3;
        uVar7 = 4;
        do {
          uVar17 = uVar7;
          uVar8 = (uint)uVar11;
          if (uVar8 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_00105989;
          }
          if (uVar8 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_00105989;
          }
          if (uVar8 < 10000) goto LAB_00105989;
          uVar11 = uVar11 / 10000;
          uVar7 = uVar17 + 4;
        } while (99999 < uVar8);
        uVar17 = uVar17 + 1;
      }
LAB_00105989:
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar2 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_f0 + (ulong)(uVar2 >> 0x1f)),uVar17,uVar3);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1092b2);
      pRVar5 = local_a8;
      plVar10 = puVar9 + 2;
      if ((long *)*puVar9 == plVar10) {
        local_120 = *plVar10;
        lStack_118 = puVar9[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar10;
        local_130 = (long *)*puVar9;
      }
      local_128 = puVar9[1];
      *puVar9 = plVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      pPVar12 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pPVar12) {
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pPVar12;
        lStack_f8 = plVar10[3];
      }
      else {
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pPVar12;
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar10;
      }
      local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar10[1];
      *plVar10 = (long)pPVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)psVar18,
                 (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start);
      if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,'\x01');
      *(undefined1 *)local_f0 = 0x31;
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1092bb);
      plVar10 = puVar9 + 2;
      if ((long *)*puVar9 == plVar10) {
        local_120 = *plVar10;
        lStack_118 = puVar9[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar10;
        local_130 = (long *)*puVar9;
      }
      local_128 = puVar9[1];
      *puVar9 = plVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      pPVar13 = (Point *)(plVar10 + 2);
      if ((Point *)*plVar10 == pPVar13) {
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pPVar13;
        lStack_f8 = plVar10[3];
      }
      else {
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pPVar13;
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (Point *)*plVar10;
      }
      local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar10[1];
      *plVar10 = (long)pPVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)psVar18,
                 (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start);
      if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      std::__cxx11::string::append((char *)psVar18);
      lVar6 = local_80;
      Polygon::get_vertices
                (&local_50,
                 (pRVar5->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start[local_80].polygon);
      std::__cxx11::string::append((char *)psVar18);
      uVar11 = 0;
      while( true ) {
        Polygon::get_vertices
                  (&local_110,
                   (local_a8->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar6].polygon);
        pPVar4 = local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pPVar12 = local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (Point *)0x0) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((ulong)((long)pPVar4 - (long)pPVar12 >> 3) <= uVar11) break;
        uVar2 = local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11].X;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar14 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar14;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00105cfb;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00105cfb;
            }
            if (uVar8 < 10000) goto LAB_00105cfb;
            uVar14 = uVar14 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_00105cfb:
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct
                  ((ulong)local_78,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_78[0]),uVar17,uVar3);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1092d8);
        local_a0 = &local_90;
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_90 = *plVar15;
          lStack_88 = plVar10[3];
        }
        else {
          local_90 = *plVar15;
          local_a0 = (long *)*plVar10;
        }
        local_98 = plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        puVar16 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar16) {
          local_e0 = *puVar16;
          lStack_d8 = puVar9[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar16;
          local_f0 = (ulong *)*puVar9;
        }
        local_e8 = puVar9[1];
        *puVar9 = puVar16;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        uVar2 = local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11].Y;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar17 = 1;
        if (9 < uVar3) {
          uVar14 = (ulong)uVar3;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar8 = (uint)uVar14;
            if (uVar8 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00105e6a;
            }
            if (uVar8 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00105e6a;
            }
            if (uVar8 < 10000) goto LAB_00105e6a;
            uVar14 = uVar14 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar8);
          uVar17 = uVar17 + 1;
        }
LAB_00105e6a:
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_c8,(char)uVar17 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_c8),uVar17,uVar3);
        psVar18 = local_d0;
        uVar14 = 0xf;
        if (local_f0 != &local_e0) {
          uVar14 = local_e0;
        }
        if (uVar14 < (ulong)(local_c0 + local_e8)) {
          uVar14 = 0xf;
          if (local_c8 != local_b8) {
            uVar14 = local_b8[0];
          }
          if (uVar14 < (ulong)(local_c0 + local_e8)) goto LAB_00105ef2;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_00105ef2:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_c8);
        }
        local_130 = &local_120;
        plVar10 = puVar9 + 2;
        if ((long *)*puVar9 == plVar10) {
          local_120 = *plVar10;
          lStack_118 = puVar9[3];
        }
        else {
          local_120 = *plVar10;
          local_130 = (long *)*puVar9;
        }
        local_128 = puVar9[1];
        *puVar9 = plVar10;
        puVar9[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        pPVar13 = (Point *)(plVar10 + 2);
        if ((Point *)*plVar10 == pPVar13) {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar13;
          lStack_f8 = plVar10[3];
        }
        else {
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar13;
          local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
          super__Vector_impl_data._M_start = (Point *)*plVar10;
        }
        local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar10[1];
        *plVar10 = (long)pPVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)psVar18,
                   (ulong)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        Polygon::get_vertices
                  (&local_110,
                   (local_a8->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar6].polygon);
        pPVar4 = local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pPVar12 = local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (Point *)0x0) {
          operator_delete(local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar11 = uVar11 + 1;
        if ((long)pPVar4 - (long)pPVar12 >> 3 != uVar11) {
          std::__cxx11::string::append((char *)psVar18);
        }
      }
      std::__cxx11::string::append((char *)psVar18);
      std::__cxx11::string::append((char *)psVar18);
      std::__cxx11::string::append((char *)psVar18);
      if (local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 1;
    } while (local_80 < local_a8->elements);
  }
  return;
}

Assistant:

void RTree::showAll_values_JSON(RTree_node *node, int level, std::string &json)
{
    if(!node->is_leaf)
    {
        for(int i=0; i<node->elements; i++)
        {
            
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(0)+",\n";
            json += "\"key\":"+std::to_string(node->data_internal_node[i].region->get_key())+",\n";
            json += "\"elements\":[";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmin().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmin().get_Y())+"],\n";
            json +="["+std::to_string(node->data_internal_node[i].region->get_Pmax().get_X())+","+std::to_string(node->data_internal_node[i].region->get_Pmax().get_Y())+"]\n";
            json +="]}";
            json +=",";
            showAll_values_JSON(node->data_internal_node[i].child, level+1, json);

        }
    }
    else
    {
        for(int i=0; i<node->elements; i++)
        {
            json +="{";
            json += "\"level\":"+std::to_string(node->at_level)+",\n";
            json += "\"is_leaf\":"+std::to_string(1)+",\n";
            json += "\"elements\":[";
            std::vector<Point> vertices = node->data_leafs[i].polygon->get_vertices();
            json += "[";
            for(int j=0; j<node->data_leafs[i].polygon->get_vertices().size(); j++)
            {
            json +="["+std::to_string(vertices[j].get_X())+","+std::to_string(vertices[j].get_Y())+"]";
            if(j+1 != node->data_leafs[i].polygon->get_vertices().size())
                    json += ",\n";
            }
            json += "]";
            json +="]}";
            json +=",";
        }
    }
}